

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ArgMaxParameter::Clear(ArgMaxParameter *this)

{
  ArgMaxParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    memset(&this->out_max_val_,0,8);
    this->top_k_ = 1;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ArgMaxParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ArgMaxParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&out_max_val_, 0, reinterpret_cast<char*>(&axis_) -
      reinterpret_cast<char*>(&out_max_val_) + sizeof(axis_));
    top_k_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}